

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O2

Value * duckdb::ScalarFunctionExtractor::GetReturnType
                  (Value *__return_storage_ptr__,ScalarFunctionCatalogEntry *entry,idx_t offset)

{
  string local_150;
  ScalarFunction local_130;
  
  FunctionSet<duckdb::ScalarFunction>::GetFunctionByOffset
            (&local_130,&(entry->functions).super_FunctionSet<duckdb::ScalarFunction>,offset);
  LogicalType::ToString_abi_cxx11_(&local_150,&local_130.super_BaseScalarFunction.return_type);
  Value::Value(__return_storage_ptr__,&local_150);
  ::std::__cxx11::string::~string((string *)&local_150);
  ScalarFunction::~ScalarFunction(&local_130);
  return __return_storage_ptr__;
}

Assistant:

static Value GetReturnType(ScalarFunctionCatalogEntry &entry, idx_t offset) {
		return Value(entry.functions.GetFunctionByOffset(offset).return_type.ToString());
	}